

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void n_string_suite::n_string_backslash_00(void)

{
  char input [5];
  string_view view;
  reader reader;
  undefined4 local_170;
  value local_16c;
  char local_168 [8];
  view_type local_160;
  basic_reader<char> local_150;
  
  local_160._M_str = local_168;
  local_168[4] = 0;
  local_168[0] = '[';
  local_168[1] = '\\';
  local_168[2] = '\0';
  local_168[3] = ']';
  local_160._M_len = 5;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_150,&local_160);
  local_16c = local_150.decoder.current.code;
  local_170 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x76c,"void n_string_suite::n_string_backslash_00()",&local_16c,&local_170);
  trial::protocol::json::basic_reader<char>::next(&local_150);
  local_16c = local_150.decoder.current.code;
  local_170 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x76e,"void n_string_suite::n_string_backslash_00()",&local_16c,&local_170);
  if (local_150.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void n_string_backslash_00()
{
    const char input[] = "[\\\x00]";
    core::detail::string_view view(input, sizeof(input)); // Capture nil character
    json::reader reader(view);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}